

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O3

void __thiscall
icu_63::Normalizer2Impl::addComposites(Normalizer2Impl *this,uint16_t *list,UnicodeSet *set)

{
  ushort uVar1;
  uint16_t uVar2;
  uint uVar3;
  long lVar4;
  
  do {
    uVar1 = *list;
    uVar3 = (uint)list[1];
    if ((uVar1 & 1) == 0) {
      lVar4 = 4;
    }
    else {
      uVar3 = (list[1] & 0x3f) << 0x10 | (uint)list[2];
      lVar4 = 6;
    }
    if ((uVar3 & 1) != 0) {
      uVar2 = getRawNorm16(this,uVar3 >> 1);
      addComposites(this,(uint16_t *)
                         ((long)this->extraData +
                         (ulong)(*(ushort *)((long)this->extraData + (ulong)(uVar2 & 0xfffe)) & 0x1f
                                ) * 2 + (ulong)(uVar2 & 0xfffe) + 2),set);
    }
    list = (uint16_t *)((long)list + lVar4);
    UnicodeSet::add(set,uVar3 >> 1);
  } while (-1 < (short)uVar1);
  return;
}

Assistant:

void Normalizer2Impl::addComposites(const uint16_t *list, UnicodeSet &set) const {
    uint16_t firstUnit;
    int32_t compositeAndFwd;
    do {
        firstUnit=*list;
        if((firstUnit&COMP_1_TRIPLE)==0) {
            compositeAndFwd=list[1];
            list+=2;
        } else {
            compositeAndFwd=(((int32_t)list[1]&~COMP_2_TRAIL_MASK)<<16)|list[2];
            list+=3;
        }
        UChar32 composite=compositeAndFwd>>1;
        if((compositeAndFwd&1)!=0) {
            addComposites(getCompositionsListForComposite(getRawNorm16(composite)), set);
        }
        set.add(composite);
    } while((firstUnit&COMP_1_LAST_TUPLE)==0);
}